

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# min_max.h
# Opt level: O2

void __thiscall
mp::
MinOrMaxConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,-1>
::
ConvertNonConvexPart<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::MinId>>
          (MinOrMaxConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,_1>
           *this,CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MinId>
                 *mc)

{
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
  *this_00;
  size_type sVar1;
  initializer_list<double> __l;
  initializer_list<int> __l_00;
  allocator_type local_3c2;
  allocator_type local_3c1;
  int local_3c0;
  int local_3bc;
  CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MinId>
  *local_3b8;
  int local_3b0;
  int local_3ac;
  _Vector_base<double,_std::allocator<double>_> local_3a8;
  MinOrMaxConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,_1>
  *local_390;
  size_type local_388;
  size_type local_380;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
  *local_378;
  vector<int,_std::allocator<int>_> flags;
  double local_358 [3];
  _Vector_base<int,_std::allocator<int>_> local_340;
  LinTerms local_328;
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_> local_2b0;
  LinTerms local_210;
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_> local_198;
  IndicatorConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_> local_f8;
  
  sVar1 = (long)(mc->
                super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::MinId>
                ).args_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(mc->
                super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::MinId>
                ).args_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start >> 2;
  local_3b8 = mc;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  ::AddVars_returnIds(&flags,*(FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                               **)this,sVar1,0.0,1.0,INTEGER);
  this_00 = *(FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
              **)this;
  local_340._M_impl.super__Vector_impl_data._M_start = (pointer)0x3ff0000000000000;
  local_390 = this;
  local_388 = sVar1;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_3a8,sVar1,
             (value_type_conflict *)&local_340,(allocator_type *)local_358);
  LinTerms::LinTerms(&local_328,(vector<double,_std::allocator<double>_> *)&local_3a8,&flags);
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>::AlgebraicConstraint
            (&local_2b0,&local_328,(AlgConRhs<1>)0x3ff0000000000000,true);
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
  ::AddConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<1>>>(this_00,&local_2b0);
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>::~AlgebraicConstraint(&local_2b0);
  LinTerms::~LinTerms(&local_328);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_3a8);
  local_3c0 = (local_3b8->super_FunctionalConstraint).result_var_;
  sVar1 = 0;
  while (local_388 != sVar1) {
    local_378 = *(FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
                  **)local_390;
    local_3bc = flags.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start[sVar1];
    local_358[0] = -1.0;
    local_358[1] = 1.0;
    __l._M_len = 2;
    __l._M_array = local_358;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_3a8,__l,&local_3c1);
    local_3b0 = local_3c0;
    local_3ac = (local_3b8->
                super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::MinId>
                ).args_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[sVar1];
    __l_00._M_len = 2;
    __l_00._M_array = &local_3b0;
    local_380 = sVar1;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&local_340,__l_00,&local_3c2);
    LinTerms::LinTerms(&local_210,(vector<double,_std::allocator<double>_> *)&local_3a8,
                       (vector<int,_std::allocator<int>_> *)&local_340);
    AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>::AlgebraicConstraint
              (&local_198,&local_210,(AlgConRhs<_1>)0x0,true);
    IndicatorConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>_>::
    IndicatorConstraint(&local_f8,local_3bc,1,&local_198);
    FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
    ::
    AddConstraint<mp::IndicatorConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<_1>>>>
              (local_378,&local_f8);
    IndicatorConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>_>::
    ~IndicatorConstraint(&local_f8);
    AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>::~AlgebraicConstraint(&local_198);
    LinTerms::~LinTerms(&local_210);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_340);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_3a8);
    sVar1 = local_380 + 1;
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&flags.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void ConvertNonConvexPart(const MinOrMaxConstraint& mc) {
    const auto& args = mc.GetArguments();
    const std::size_t nargs = args.size();
    const auto flags =                            // binary flags
        GetMC().AddVars_returnIds(nargs, 0.0, 1.0, var::Type::INTEGER);
    GetMC().AddConstraint(LinConGE(               // sum of the flags >= 1
               { std::vector<double>(nargs, 1.0),
                                   flags }, 1.0));
    const auto resvar = mc.GetResultVar();
    for (size_t i=0; i<nargs; ++i) {
      GetMC().AddConstraint(
                     IndicatorConstraintLinLE{flags[i], 1,
                         { { {1.0*sense, -1.0*sense},
                             {resvar, args[i]} }, 0.0 }});
    }
  }